

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault
          (FieldGeneratorMap *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = -1;
  lVar2 = 0;
  do {
    lVar4 = (long)*(int *)(this->descriptor_ + 4);
    lVar3 = lVar3 + 1;
    if (lVar4 <= lVar3) break;
    bVar1 = HasNonZeroDefaultValue((FieldDescriptor *)(lVar2 + *(long *)(this->descriptor_ + 0x28)))
    ;
    lVar2 = lVar2 + 0x48;
  } while (!bVar1);
  return lVar3 < lVar4;
}

Assistant:

bool FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(void) const {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (HasNonZeroDefaultValue(descriptor_->field(i))) {
      return true;
    }
  }

  return false;
}